

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O0

char16 * __thiscall Js::CompoundString::GetSz(CompoundString *this)

{
  code *pcVar1;
  bool bVar2;
  CharCount CVar3;
  charcount_t cVar4;
  JavascriptLibrary *this_00;
  CharStringCache *this_01;
  char16 *pcVar5;
  JavascriptString *this_02;
  Block **ppBVar6;
  ScriptContext *this_03;
  Recycler *pRVar7;
  undefined4 *puVar8;
  TrackAllocData local_68;
  CompoundString *local_40;
  char16 *buffer;
  char16 *buffer_3;
  char16 *buffer_2;
  char16 *buffer_1;
  CompoundString *pCStack_18;
  CharCount totalCharLength;
  CompoundString *this_local;
  
  pCStack_18 = this;
  bVar2 = JavascriptString::IsFinalized((JavascriptString *)this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,999,"(!IsFinalized())","!IsFinalized()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  buffer_1._4_4_ = JavascriptString::GetLength((JavascriptString *)this);
  if (buffer_1._4_4_ == 0) {
    Unreference(this);
    buffer_2 = L"";
    JavascriptString::SetBuffer((JavascriptString *)this,L"");
    LiteralStringWithPropertyStringPtr::ConvertString<Js::CompoundString>(this);
    this_local = (CompoundString *)0x180ca08;
  }
  else if (buffer_1._4_4_ == 1) {
    bVar2 = HasOnlyDirectChars(this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                  ,0x3f7,"(HasOnlyDirectChars())","HasOnlyDirectChars()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    CVar3 = LastBlockCharLength(this);
    if (CVar3 != 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                  ,0x3f8,"(LastBlockCharLength() == 1)","LastBlockCharLength() == 1"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    this_00 = RecyclableObject::GetLibrary((RecyclableObject *)this);
    this_01 = JavascriptLibrary::GetCharStringCache(this_00);
    pcVar5 = LastBlockChars(this);
    this_02 = CharStringCache::GetStringForChar(this_01,*pcVar5);
    buffer_3 = JavascriptString::UnsafeGetBuffer(this_02);
    Unreference(this);
    JavascriptString::SetBuffer((JavascriptString *)this,buffer_3);
    LiteralStringWithPropertyStringPtr::ConvertString<Js::CompoundString>(this);
    this_local = (CompoundString *)buffer_3;
  }
  else {
    bVar2 = OwnsLastBlock(this);
    if ((((bVar2) && (bVar2 = HasOnlyDirectChars(this), bVar2)) &&
        (ppBVar6 = Memory::WriteBarrierPtr::operator_cast_to_Block__
                             ((WriteBarrierPtr *)&this->lastBlock), *ppBVar6 == (Block *)0x0)) &&
       (bVar2 = TryAppendGeneric<Js::CompoundString>(L'\0',this), bVar2)) {
      JavascriptString::SetLength((JavascriptString *)this,buffer_1._4_4_);
      buffer = LastBlockChars(this);
      Unreference(this);
      JavascriptString::SetBuffer((JavascriptString *)this,buffer);
      LiteralStringWithPropertyStringPtr::ConvertString<Js::CompoundString>(this);
      this_local = (CompoundString *)buffer;
    }
    else {
      this_03 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      pRVar7 = ScriptContext::GetRecycler(this_03);
      cVar4 = JavascriptString::SafeSzSize(buffer_1._4_4_);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_68,(type_info *)&char16_t::typeinfo,0,(ulong)cVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                 ,0x40f);
      pRVar7 = Memory::Recycler::TrackAllocInfo(pRVar7,&local_68);
      cVar4 = JavascriptString::SafeSzSize(buffer_1._4_4_);
      local_40 = (CompoundString *)
                 Memory::AllocateArray<Memory::Recycler,char16_t,false>
                           ((Memory *)pRVar7,(Recycler *)Memory::Recycler::AllocLeaf,0,(ulong)cVar4)
      ;
      *(char16_t *)
       ((long)&(local_40->super_LiteralString).super_JavascriptString.super_RecyclableObject.
               super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject +
       (ulong)buffer_1._4_4_ * 2) = L'\0';
      JavascriptString::Copy<Js::CompoundString>
                ((JavascriptString *)this,(char16 *)local_40,buffer_1._4_4_);
      if (*(char16_t *)
           ((long)&(local_40->super_LiteralString).super_JavascriptString.super_RecyclableObject.
                   super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
           + (ulong)buffer_1._4_4_ * 2) != L'\0') {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                    ,0x412,"(buffer[totalCharLength] == u\'\\0\')",
                                    "buffer[totalCharLength] == _u(\'\\0\')");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      Unreference(this);
      JavascriptString::SetBuffer((JavascriptString *)this,(char16 *)local_40);
      LiteralStringWithPropertyStringPtr::ConvertString<Js::CompoundString>(this);
      this_local = local_40;
    }
  }
  return (char16 *)this_local;
}

Assistant:

const char16 *CompoundString::GetSz()
    {
        Assert(!IsFinalized());

        const CharCount totalCharLength = GetLength();
        switch(totalCharLength)
        {
            case 0:
            {
                Unreference();
                const char16 *const buffer = _u("");
                SetBuffer(buffer);
                LiteralStringWithPropertyStringPtr::ConvertString(this);
                return buffer;
            }

            case 1:
            {
                Assert(HasOnlyDirectChars());
                Assert(LastBlockCharLength() == 1);

                const char16 *const buffer = GetLibrary()->GetCharStringCache().GetStringForChar(LastBlockChars()[0])->UnsafeGetBuffer();
                Unreference();
                SetBuffer(buffer);
                LiteralStringWithPropertyStringPtr::ConvertString(this);
                return buffer;
            }
        }

        if(OwnsLastBlock() && HasOnlyDirectChars() && !lastBlock && TryAppendGeneric(_u('\0'), this)) // GetSz() requires null termination
        {
            // There is no last block. Only the buffer was allocated, and is held in 'lastBlockInfo'. Since this string owns the
            // last block, has only direct chars, and the buffer was allocated directly (buffer pointer is not an internal
            // pointer), there is no need to copy the buffer.
            SetLength(totalCharLength); // terminating null should not count towards the string length
            const char16 *const buffer = LastBlockChars();
            Unreference();
            SetBuffer(buffer);
            LiteralStringWithPropertyStringPtr::ConvertString(this);
            return buffer;
        }

        char16 *const buffer = RecyclerNewArrayLeaf(GetScriptContext()->GetRecycler(), char16, SafeSzSize(totalCharLength));
        buffer[totalCharLength] = _u('\0'); // GetSz() requires null termination
        Copy<CompoundString>(buffer, totalCharLength);
        Assert(buffer[totalCharLength] == _u('\0'));
        Unreference();
        SetBuffer(buffer);
        LiteralStringWithPropertyStringPtr::ConvertString(this);
        return buffer;
    }